

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::StackArray::RunWithCapacity
          (StackArray *this,size_t capacity,Func f)

{
  Func f_00;
  Func f_01;
  Func f_02;
  Func f_03;
  Func f_04;
  
  f_00.invoker_ = f.ptr_;
  if (this < (StackArray *)0x281) {
    switch((ulong)(this + 0x7f) >> 7) {
    case 1:
      f_00.ptr_.obj = f_00.invoker_;
      str_format_internal::(anonymous_namespace)::StackArray::RunWithCapacityImpl<1ul>
                ((StackArray *)capacity,f_00);
      return;
    case 2:
      f_04.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)f_00.invoker_;
      f_04.ptr_.obj = f_00.invoker_;
      str_format_internal::(anonymous_namespace)::StackArray::RunWithCapacityImpl<2ul>
                ((StackArray *)capacity,f_04);
      return;
    case 3:
      f_02.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)f_00.invoker_;
      f_02.ptr_.obj = f_00.invoker_;
      str_format_internal::(anonymous_namespace)::StackArray::RunWithCapacityImpl<3ul>
                ((StackArray *)capacity,f_02);
      return;
    case 4:
      f_03.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)f_00.invoker_;
      f_03.ptr_.obj = f_00.invoker_;
      str_format_internal::(anonymous_namespace)::StackArray::RunWithCapacityImpl<4ul>
                ((StackArray *)capacity,f_03);
      return;
    case 5:
      f_01.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)f_00.invoker_;
      f_01.ptr_.obj = f_00.invoker_;
      str_format_internal::(anonymous_namespace)::StackArray::RunWithCapacityImpl<5ul>
                ((StackArray *)capacity,f_01);
      return;
    default:
      __assert_fail("false && \"Invalid capacity\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                    ,0x5a,
                    "static void absl::str_format_internal::(anonymous namespace)::StackArray::RunWithCapacity(size_t, Func)"
                   );
    }
  }
  __assert_fail("capacity <= kMaxCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0x4a,
                "static void absl::str_format_internal::(anonymous namespace)::StackArray::RunWithCapacity(size_t, Func)"
               );
}

Assistant:

static void RunWithCapacity(size_t capacity, Func f) {
    assert(capacity <= kMaxCapacity);
    const size_t step = (capacity + kStep - 1) / kStep;
    assert(step <= kNumSteps);
    switch (step) {
      case 1:
        return RunWithCapacityImpl<1>(f);
      case 2:
        return RunWithCapacityImpl<2>(f);
      case 3:
        return RunWithCapacityImpl<3>(f);
      case 4:
        return RunWithCapacityImpl<4>(f);
      case 5:
        return RunWithCapacityImpl<5>(f);
    }

    assert(false && "Invalid capacity");
  }